

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  void *this;
  ulong uVar4;
  undefined1 *puVar5;
  char *pcVar6;
  char cVar7;
  char *local_2e0;
  long local_2b0;
  size_type sqLoc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  allocator local_259;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string code;
  stringstream local_1c8 [8];
  stringstream stream;
  undefined1 local_1b8 [383];
  byte local_39;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *string_to_escape_local;
  string *escaped_string;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2._M_current = (char *)::std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)::std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
    cVar7 = (char)__return_storage_ptr__;
    if (!bVar1) break;
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end2);
    local_39 = *pbVar3;
    iVar2 = isprint((uint)local_39);
    if (iVar2 == 0) {
      ::std::__cxx11::stringstream::stringstream(local_1c8);
      this = (void *)::std::ostream::operator<<(local_1b8,std::hex);
      ::std::ostream::operator<<(this,(uint)local_39);
      ::std::__cxx11::stringstream::str();
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_258,"\\x",&local_259);
      uVar4 = ::std::__cxx11::string::size();
      pcVar6 = "";
      if (uVar4 < 2) {
        pcVar6 = "0";
      }
      ::std::operator+(&local_238,&local_258,pcVar6);
      ::std::operator+(&local_218,&local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f8);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_218);
      ::std::__cxx11::string::~string((string *)&local_238);
      ::std::__cxx11::string::~string((string *)&local_258);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
      ::std::__cxx11::string::~string((string *)local_1f8);
      ::std::__cxx11::stringstream::~stringstream(local_1c8);
    }
    else if ((local_39 == 0x78) || (local_39 == 0x58)) {
      uVar4 = ::std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (pcVar6 = (char *)::std::__cxx11::string::back(), *pcVar6 == '\\'))
      {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_2a0,"\\x",(allocator *)((long)&sqLoc + 7));
        if (local_39 == 0x78) {
          local_2e0 = "578";
        }
        else {
          local_2e0 = "458";
        }
        local_2e0 = local_2e0 + 1;
        ::std::operator+(&local_280,&local_2a0,local_2e0);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_280);
        ::std::__cxx11::string::~string((string *)&local_280);
        ::std::__cxx11::string::~string((string *)&local_2a0);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&sqLoc + 7));
      }
      else {
        ::std::__cxx11::string::push_back(cVar7);
      }
    }
    else {
      ::std::__cxx11::string::push_back(cVar7);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  bVar1 = ::std::operator!=(__return_storage_ptr__,string_to_escape);
  if (bVar1) {
    local_2b0 = ::std::__cxx11::string::find(cVar7,0x27);
    while (local_2b0 != -1) {
      puVar5 = (undefined1 *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar5 = 0x5c;
      ::std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)(local_2b0 + 1));
      local_2b0 = ::std::__cxx11::string::find(cVar7,0x27);
    }
    ::std::__cxx11::string::insert((ulong)__return_storage_ptr__,(char *)0x0);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
    ::std::__cxx11::string::push_back(cVar7);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;
        } else if(c == 'x' || c == 'X') {
            // need to check for inadvertent binary sequences
            if(!escaped_string.empty() && escaped_string.back() == '\\') {
                escaped_string += std::string("\\x") + (c == 'x' ? "78" : "58");
            } else {
                escaped_string.push_back(c);
            }

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}